

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

bool __thiscall llvm::StringRef::consume_front(StringRef *this,StringRef Prefix)

{
  bool bVar1;
  StringRef SVar2;
  
  bVar1 = startswith(this,Prefix);
  if (bVar1) {
    SVar2 = drop_front(this,Prefix.Length);
    *this = SVar2;
  }
  return bVar1;
}

Assistant:

bool consume_front(StringRef Prefix) {
      if (!startswith(Prefix))
        return false;

      *this = drop_front(Prefix.size());
      return true;
    }